

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O1

void __thiscall cmDepends::~cmDepends(cmDepends *this)

{
  ~cmDepends(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

cmDepends::~cmDepends() = default;